

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O3

int AF_A_FAxeAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  VM_UBYTE VVar2;
  int iVar3;
  int damage;
  undefined8 *puVar4;
  player_t *ppVar5;
  APlayerPawn *t1;
  AWeapon *pAVar6;
  AAmmo *pAVar7;
  AActor *pAVar8;
  uint uVar9;
  uint uVar10;
  PClass *pPVar11;
  FState *pFVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  VMValue *pVVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined8 *puVar19;
  int iVar20;
  bool bVar21;
  bool bVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  FTranslatedLineTarget t;
  FName local_bc;
  double local_b8;
  PClassActor *local_b0;
  player_t *local_a8;
  DAngle local_a0;
  DAngle local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  FName local_78;
  FName local_74;
  FTranslatedLineTarget local_70;
  undefined1 local_58 [32];
  DAngle local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar13 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar15 = "(paramnum) < numparam";
    goto LAB_005dbf86;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005dbf76;
  puVar19 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar19 == (undefined8 *)0x0) goto LAB_005dbb28;
    auVar24._8_8_ = uVar13;
    auVar24._0_8_ = puVar19[1];
    if (puVar19[1] == 0) {
      auVar24 = (**(code **)*puVar19)(puVar19);
      puVar19[1] = auVar24._0_8_;
    }
    pPVar11 = auVar24._0_8_;
    bVar21 = pPVar11 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar21;
    uVar13 = (ulong)bVar21;
    bVar22 = pPVar11 == pPVar1;
    if (!bVar22 && !bVar21) {
      do {
        pPVar11 = pPVar11->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar11 != (PClass *)0x0);
        if (pPVar11 == pPVar1) break;
      } while (pPVar11 != (PClass *)0x0);
    }
    pVVar14 = (VMValue *)(ulong)(bVar22 || bVar21);
    if ((char)ret == '\0') {
      pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005dbf86;
    }
  }
  else {
    if (puVar19 != (undefined8 *)0x0) goto LAB_005dbf76;
LAB_005dbb28:
    puVar19 = (undefined8 *)0x0;
    pVVar14 = param;
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005dbbe5;
  VVar2 = param[1].field_0.field_3.Type;
  if (VVar2 != 0xff) {
    if (VVar2 != '\x03') {
LAB_005dbf76:
      pcVar15 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005dbf86;
    }
    puVar4 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar4 != (undefined8 *)0x0) {
        pPVar11 = (PClass *)puVar4[1];
        if (pPVar11 == (PClass *)0x0) {
          pPVar11 = (PClass *)(**(code **)*puVar4)(puVar4,pVVar14,uVar13,ret);
          puVar4[1] = pPVar11;
        }
        bVar21 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar1 && bVar21) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar21 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar1) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar21) {
          pcVar15 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dbf86;
        }
      }
    }
    else if (puVar4 != (undefined8 *)0x0) goto LAB_005dbf76;
  }
  if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
     ((VVar2 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dbbe5:
    ppVar5 = (player_t *)puVar19[0x40];
    if (ppVar5 != (player_t *)0x0) {
      t1 = ppVar5->mo;
      uVar9 = FRandom::GenRand32(&pr_axeatk);
      uVar10 = FRandom::GenRand32(&pr_axeatk);
      iVar3 = (((ppVar5->ReadyWeapon->Ammo1).field_0.p)->super_AInventory).Amount;
      pcVar15 = "AxePuff";
      if (iVar3 < 1) {
        uVar23 = 0;
      }
      else {
        pcVar15 = "AxePuffGlow";
        uVar23 = 0x40180000;
      }
      local_b8 = (double)((ulong)uVar23 << 0x20);
      damage = (uVar10 & 7) + (uVar9 & 0xf) + 0x28 << (0 < iVar3);
      local_a8 = ppVar5;
      local_b0 = PClass::FindActor(pcVar15);
      iVar20 = 0;
      iVar18 = 0;
      do {
        iVar16 = 3;
        iVar17 = iVar18;
        do {
          pAVar8 = (AActor *)((double)iVar17 * 2.8125 + (t1->super_AActor).Angles.Yaw.Degrees);
          local_90 = 0;
          local_88._0_8_ = pAVar8;
          P_AimLineAttack((AActor *)(local_88 + 8),(DAngle *)t1,144.0,
                          (FTranslatedLineTarget *)local_88,(DAngle *)&local_70,(int)&local_90,
                          (AActor *)0x0,(AActor *)0x0);
          if (local_70.linetarget != (AActor *)0x0) {
            local_a0.Degrees = (double)local_88._8_8_;
            local_bc.Index = 0x84;
            local_98.Degrees = (double)pAVar8;
            P_LineAttack(&t1->super_AActor,&local_98,144.0,&local_a0,damage,&local_bc,local_b0,1,
                         &local_70,(int *)0x0);
            if (local_70.linetarget != (AActor *)0x0) {
              if (((((local_70.linetarget)->flags3).Value & 0x2000) != 0) ||
                 ((local_70.linetarget)->player != (player_t *)0x0)) {
                local_38.Degrees = local_70.angleFromSource.Degrees;
                AActor::Thrust(local_70.linetarget,&local_38,local_b8);
              }
              AdjustPlayerAngle(&t1->super_AActor,&local_70);
              ppVar5 = local_a8;
              if (0 < iVar3) {
                pAVar6 = local_a8->ReadyWeapon;
                if (pAVar6 == (AWeapon *)0x0) {
                  return 0;
                }
                AWeapon::DepleteAmmo(pAVar6,pAVar6->bAltFire,false,-1);
                pAVar7 = (pAVar6->Ammo1).field_0.p;
                if (pAVar7 != (AAmmo *)0x0) {
                  if (((pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject.
                       ObjectFlags & 0x20) == 0) {
                    if ((pAVar7->super_AInventory).Amount != 0) {
                      return 0;
                    }
                  }
                  else {
                    (pAVar6->Ammo1).field_0.p = (AAmmo *)0x0;
                  }
                }
                if ((((pAVar6->super_AInventory).field_0x4dc & 0x80) != 0) &&
                   (pAVar7 = (pAVar6->Ammo2).field_0.p, pAVar7 != (AAmmo *)0x0)) {
                  if (((pAVar7->super_AInventory).super_AActor.super_DThinker.super_DObject.
                       ObjectFlags & 0x20) == 0) {
                    if ((pAVar7->super_AInventory).Amount != 0) {
                      return 0;
                    }
                  }
                  else {
                    (pAVar6->Ammo2).field_0.p = (AAmmo *)0x0;
                  }
                }
                pAVar6 = ppVar5->ReadyWeapon;
                local_78.Index = FName::NameManager::FindName(&FName::NameData,"Fire",false);
                pFVar12 = AActor::FindState((AActor *)pAVar6,&local_78);
                P_SetPsprite(ppVar5,PSP_WEAPON,pFVar12 + 5,false);
                return 0;
              }
              return 0;
            }
          }
          iVar17 = iVar17 + iVar20;
          bVar21 = SCARRY4(iVar16,-2);
          iVar16 = iVar16 + -2;
        } while (iVar16 != 0 && bVar21 == iVar16 < 0);
        iVar18 = iVar18 + 1;
        iVar20 = iVar20 + -2;
      } while (iVar18 != 0x10);
      (t1->super_AActor).weaponspecial = 0;
      pPVar1 = (PClass *)(t1->super_AActor).Angles.Yaw.Degrees;
      local_58._16_8_ = (DObject *)0x0;
      local_58._24_8_ = pPVar1;
      P_AimLineAttack((AActor *)local_58,(DAngle *)t1,64.0,
                      (FTranslatedLineTarget *)(local_58 + 0x18),(DAngle *)0x0,(int)local_58 + 0x10,
                      (AActor *)0x0,(AActor *)0x0);
      local_74.Index = 0x84;
      local_58._8_8_ = pPVar1;
      P_LineAttack(&t1->super_AActor,(DAngle *)(local_58 + 8),64.0,(DAngle *)local_58,damage,
                   &local_74,local_b0,1,(FTranslatedLineTarget *)0x0,(int *)0x0);
    }
    return 0;
  }
  pcVar15 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005dbf86:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,200,"int AF_A_FAxeAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeAttack)
{
	PARAM_ACTION_PROLOGUE;

	DAngle angle;
	int power;
	int damage;
	DAngle slope;
	int i;
	int useMana;
	player_t *player;
	AWeapon *weapon;
	PClassActor *pufftype;
	FTranslatedLineTarget t;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	AActor *pmo=player->mo;

	damage = 40+(pr_axeatk()&15);
	damage += pr_axeatk()&7;
	power = 0;
	weapon = player->ReadyWeapon;
	if (player->ReadyWeapon->Ammo1->Amount > 0)
	{
		damage <<= 1;
		power = 6;
		pufftype = PClass::FindActor ("AxePuffGlow");
		useMana = 1;
	}
	else
	{
		pufftype = PClass::FindActor ("AxePuff");
		useMana = 0;
	}
	for (i = 0; i < 16; i++)
	{
		for (int j = 1; j >= -1; j -= 2)
		{
			angle = pmo->Angles.Yaw + j*i*(45. / 16);
			slope = P_AimLineAttack(pmo, angle, AXERANGE, &t);
			if (t.linetarget)
			{
				P_LineAttack(pmo, angle, AXERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
				if (t.linetarget != nullptr)
				{
					if (t.linetarget->flags3&MF3_ISMONSTER || t.linetarget->player)
					{
						t.linetarget->Thrust(t.angleFromSource, power);
					}
					AdjustPlayerAngle(pmo, &t);
					useMana++;
					goto axedone;
				}
			}
		}
	}
	// didn't find any creatures, so try to strike any walls
	pmo->weaponspecial = 0;

	angle = pmo->Angles.Yaw;
	slope = P_AimLineAttack (pmo, angle, MELEERANGE);
	P_LineAttack (pmo, angle, MELEERANGE, slope, damage, NAME_Melee, pufftype, true);

axedone:
	if (useMana == 2)
	{
		AWeapon *weapon = player->ReadyWeapon;
		if (weapon != nullptr)
		{
			weapon->DepleteAmmo (weapon->bAltFire, false);

			if ((weapon->Ammo1 == nullptr || weapon->Ammo1->Amount == 0) &&
				(!(weapon->WeaponFlags & WIF_PRIMARY_USES_BOTH) ||
				  weapon->Ammo2 == nullptr || weapon->Ammo2->Amount == 0))
			{
				P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Fire") + 5);
			}
		}
	}
	return 0;		
}